

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O0

int get_digit(NJDNode *node,int convert_flag)

{
  int iVar1;
  char *pcVar2;
  int in_ESI;
  NJDNode *in_RDI;
  int i;
  char *in_stack_ffffffffffffffd8;
  NJDNode *node_00;
  int local_18;
  
  pcVar2 = NJDNode_get_string(in_RDI);
  iVar1 = strcmp(pcVar2,"*");
  if (iVar1 != 0) {
    pcVar2 = NJDNode_get_pos_group1(in_RDI);
    iVar1 = strcmp(pcVar2,anon_var_dwarf_b996e + 9);
    if (iVar1 == 0) {
      for (local_18 = 0; njd_set_digit_rule_numeral_list1[local_18] != (char *)0x0;
          local_18 = local_18 + 3) {
        node_00 = (NJDNode *)njd_set_digit_rule_numeral_list1[local_18];
        pcVar2 = NJDNode_get_string(in_RDI);
        iVar1 = strcmp((char *)node_00,pcVar2);
        if (iVar1 == 0) {
          if (in_ESI == 1) {
            NJDNode_set_string(node_00,in_stack_ffffffffffffffd8);
            NJDNode_set_orig(node_00,in_stack_ffffffffffffffd8);
          }
          iVar1 = atoi(njd_set_digit_rule_numeral_list1[local_18 + 1]);
          return iVar1;
        }
      }
    }
  }
  return -1;
}

Assistant:

static int get_digit(NJDNode * node, int convert_flag)
{
   int i;

   if (strcmp(NJDNode_get_string(node), "*") == 0)
      return -1;

   if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0)
      for (i = 0; njd_set_digit_rule_numeral_list1[i] != NULL; i += 3)
         if (strcmp(njd_set_digit_rule_numeral_list1[i], NJDNode_get_string(node)) == 0) {
            if (convert_flag == 1) {
               NJDNode_set_string(node, (char *) njd_set_digit_rule_numeral_list1[i + 2]);
               NJDNode_set_orig(node, (char *) njd_set_digit_rule_numeral_list1[i + 2]);
            }
            return atoi(njd_set_digit_rule_numeral_list1[i + 1]);
         }

   return -1;
}